

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run6L.cpp
# Opt level: O1

int main(void)

{
  double *pdVar1;
  Scalar SVar2;
  time_t tVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  Matrix<double,__1,__1,_0,_4,_4> *pMVar8;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar9;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar10;
  byte bVar11;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  lPairs;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  estTrans;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  lCPairs;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  plPairs;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ptPairs;
  Matrix<double,_4,_4,_0,_4,_4> estT;
  Matrix<double,_4,_4,_0,_4,_4> transGT;
  time_t t;
  Matrix<double,_3,_3,_0,_3,_3> R;
  AngleAxis<double> axAng;
  scalar_sum_op<double,_double> local_6b9;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_6b8;
  Matrix<double,__1,__1,_0,_4,_4> local_698;
  double local_608;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_600;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_5e8;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_5c8;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_5a8;
  long local_590;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_588;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_570;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_558;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_540;
  Product<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_1>
  local_528;
  double local_4b8;
  double dStack_4b0;
  double local_4a8;
  double dStack_4a0;
  double local_498;
  double dStack_490;
  double local_488;
  double dStack_480;
  double local_478;
  double dStack_470;
  double local_468;
  double dStack_460;
  double local_458;
  double dStack_450;
  double local_448;
  double dStack_440;
  Matrix<double,_4,_4,_0,_4,_4> local_438;
  time_t local_3b0;
  double local_3a8;
  double *pdStack_3a0;
  double local_398;
  double dStack_390;
  DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *local_388;
  double dStack_380;
  double local_378;
  double dStack_370;
  double *local_368;
  AngleAxis<double> local_358;
  Matrix<double,_4,_4,_0,_4,_4> local_338;
  Matrix<double,_4,_4,_0,_4,_4> local_2b8;
  Matrix<double,_4,_4,_0,_4,_4> local_238;
  Matrix<double,_4,_4,_0,_4,_4> local_1b8;
  Matrix<double,_4,_4,_0,_4,_4> local_138;
  Matrix<double,_4,_4,_0,_4,_4> local_b8;
  
  bVar11 = 0;
  tVar3 = time(&local_3b0);
  srand((uint)tVar3);
  local_5a8.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5a8.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5a8.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5c8.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c8.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5c8.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6b8.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6b8.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6b8.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5e8.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5e8.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e8.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  getGTTransformations<double>((Matrix<double,_4,_4,_0,_4,_4> *)&local_698,true);
  pMVar8 = &local_698;
  pMVar9 = &local_438;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0]
         = (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>).m_storage.m_data
           .array[0];
    pMVar8 = (Matrix<double,__1,__1,_0,_4,_4> *)((long)pMVar8 + ((ulong)bVar11 * -2 + 1) * 8);
    pMVar9 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  pMVar9 = &local_438;
  pMVar10 = &local_b8;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar9 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
    pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  genLineIntPair<double>
            ((pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_698,&local_b8);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
  ::
  emplace_back<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
            ((vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
              *)&local_6b8,
             (pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_698);
  pMVar9 = &local_438;
  pMVar10 = &local_138;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar9 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
    pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  genLineIntPair<double>
            ((pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_698,&local_138);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
  ::
  emplace_back<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
            ((vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
              *)&local_6b8,
             (pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_698);
  pMVar9 = &local_438;
  pMVar10 = &local_1b8;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar9 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
    pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  genLineIntPair<double>
            ((pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_698,&local_1b8);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
  ::
  emplace_back<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
            ((vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
              *)&local_6b8,
             (pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_698);
  pMVar9 = &local_438;
  pMVar10 = &local_238;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar9 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
    pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  genLineIntPair<double>
            ((pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_698,&local_238);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
  ::
  emplace_back<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
            ((vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
              *)&local_6b8,
             (pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_698);
  pMVar9 = &local_438;
  pMVar10 = &local_2b8;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar9 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
    pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  genLineIntPair<double>
            ((pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_698,&local_2b8);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
  ::
  emplace_back<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
            ((vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
              *)&local_6b8,
             (pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_698);
  pMVar9 = &local_438;
  pMVar10 = &local_338;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar9 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
    pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  genLineIntPair<double>
            ((pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_698,&local_338);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
  ::
  emplace_back<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
            ((vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
              *)&local_6b8,
             (pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_698);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"GT transformation: ",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_438);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  lVar6 = std::chrono::_V2::system_clock::now();
  std::
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::vector(&local_540,&local_5a8);
  std::
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::vector(&local_558,&local_5c8);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ::vector(&local_570,&local_6b8);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ::vector(&local_588,&local_5e8);
  solver6L<double>(&local_600,&local_540,&local_558,&local_570,&local_588);
  if (local_588.
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_588.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_570.
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_570.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_570.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_570.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_558.
      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_558.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_558.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_558.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_540.
      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_540.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_540.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_540.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  lVar5 = std::chrono::_V2::system_clock::now();
  if (local_600.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_600.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_590 = (lVar5 - lVar6) / 1000;
    local_608 = 1000.0;
    lVar6 = 0x70;
    uVar7 = 0;
    do {
      pdVar1 = (double *)
               ((long)((local_600.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6 + -0x70);
      local_4b8 = *pdVar1;
      dStack_4b0 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_600.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6 + -0x60);
      local_4a8 = *pdVar1;
      dStack_4a0 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_600.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6 + -0x50);
      local_498 = *pdVar1;
      dStack_490 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_600.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6 + -0x40);
      local_488 = *pdVar1;
      dStack_480 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_600.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6 + -0x30);
      local_478 = *pdVar1;
      dStack_470 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_600.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6 + -0x20);
      local_468 = *pdVar1;
      dStack_460 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_600.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6 + -0x10);
      local_458 = *pdVar1;
      dStack_450 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_600.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6);
      local_448 = *pdVar1;
      dStack_440 = pdVar1[1];
      if (!NAN(dStack_490)) {
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[1] = (double)&local_458;
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[2] = 1.48219693752374e-323;
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[3] = 4.94065645841247e-324;
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[5] = 0.0;
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[6] = 1.48219693752374e-323;
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[7] = 1.97626258336499e-323;
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[8] = (double)(local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array + 0xc);
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[9] = 1.48219693752374e-323;
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[10] = 4.94065645841247e-324;
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xb] = (double)&local_438;
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xc] = 0.0;
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xd] = 1.48219693752374e-323;
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xe] = 1.97626258336499e-323;
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[4] = (double)&local_4b8;
        local_528.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = (long)local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                        m_storage.m_data.array[1];
        local_528.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
        m_value = (long)local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                        m_storage.m_data.array[8];
        SVar2 = Eigen::internal::
                redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const>const>>,4,0>
                ::
                run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const>const>>
                          ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>_>
                            *)&local_528,&local_6b9,
                           (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>
                            *)&local_698);
        if (SQRT(SVar2) < local_608) {
          local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
          array[1] = (double)&local_458;
          local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
          array[2] = 1.48219693752374e-323;
          local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
          array[3] = 4.94065645841247e-324;
          local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
          array[5] = 0.0;
          local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
          array[6] = 1.48219693752374e-323;
          local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
          array[7] = 1.97626258336499e-323;
          local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
          array[8] = (double)(local_438.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                              .m_storage.m_data.array + 0xc);
          local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
          array[9] = 1.48219693752374e-323;
          local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
          array[10] = 4.94065645841247e-324;
          local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
          array[0xb] = (double)&local_438;
          local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
          array[0xc] = 0.0;
          local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
          array[0xd] = 1.48219693752374e-323;
          local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
          array[0xe] = 1.97626258336499e-323;
          local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
          array[4] = (double)&local_4b8;
          local_528.m_lhs.
          super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols
          .m_value = (long)local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                           m_storage.m_data.array[1];
          local_528.m_lhs.
          super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
          m_startRow.m_value =
               (long)local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                     m_storage.m_data.array[8];
          SVar2 = Eigen::internal::
                  redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const>const>>,4,0>
                  ::
                  run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const>const>>
                            ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>_>
                              *)&local_528,&local_6b9,
                             (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>
                              *)&local_698);
          local_608 = SQRT(SVar2);
        }
        local_528.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
        m_value = 0;
        local_528.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
        m_value = 0;
        local_528.m_rhs.m_matrix.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
        m_value = 0;
        local_528.m_rhs.m_matrix.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
        m_value = 0;
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_rows =
             3;
        local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_cols =
             3;
        local_528.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
        m_value = 3;
        local_528.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = 3;
        local_528.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        m_outerStride = 4;
        local_528.m_rhs.m_matrix.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
             (PointerType)&local_438;
        local_528.m_rhs.m_matrix.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
        m_value = 3;
        local_528.m_rhs.m_matrix.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = 3;
        local_528.m_rhs.m_matrix.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        m_outerStride = 4;
        local_528.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
             (PointerType)&local_4b8;
        local_528.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
             (XprTypeNested)&local_4b8;
        local_528.m_rhs.m_matrix.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
             (XprTypeNested)
             local_528.m_rhs.m_matrix.
             super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
             m_data;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,4,4>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>,1>,Eigen::internal::assign_op<double,double>>
                  (&local_698,&local_528,(assign_op<double,_double> *)&local_6b9);
        if ((local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.
             m_rows != 3) ||
           (local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.
            m_cols != 3)) {
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 3>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 3>]"
                       );
        }
        local_3a8 = local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                    m_storage.m_data.array[0];
        pdStack_3a0 = (double *)
                      local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                      m_storage.m_data.array[1];
        local_398 = local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                    m_storage.m_data.array[2];
        dStack_390 = local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                     m_storage.m_data.array[3];
        local_388 = (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                    local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                    m_storage.m_data.array[4];
        dStack_380 = local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                     m_storage.m_data.array[5];
        local_378 = local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                    m_storage.m_data.array[6];
        dStack_370 = local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                     m_storage.m_data.array[7];
        local_368 = (double *)
                    local_698.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                    m_storage.m_data.array[8];
        Eigen::AngleAxis<double>::fromRotationMatrix<Eigen::Matrix<double,3,3,0,3,3>>
                  (&local_358,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_3a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Estimated Transformation:",0x19);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
        std::ostream::put('@');
        poVar4 = (ostream *)std::ostream::flush();
        poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                                          &local_4b8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error (frob norm): ",0x13);
        poVar4 = std::ostream::_M_insert<double>
                           (SQRT((local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xf] - dStack_440) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xf] - dStack_440) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xd] - dStack_450) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xd] - dStack_450) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xb] - dStack_460) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xb] - dStack_460) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[9] - dStack_470) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[9] - dStack_470) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[7] - dStack_480) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[7] - dStack_480) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[5] - dStack_490) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[5] - dStack_490) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[3] - dStack_4a0) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[3] - dStack_4a0) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[1] - dStack_4b0) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[1] - dStack_4b0) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xe] - local_448) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xe] - local_448) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xc] - local_458) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xc] - local_458) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[10] - local_468) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[10] - local_468) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[8] - local_478) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[8] - local_478) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[6] - local_488) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[6] - local_488) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[4] - local_498) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[4] - local_498) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[2] - local_4a8) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[2] - local_4a8) +
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0] - local_4b8) *
                                 (local_438.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0] - local_4b8)));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", time: ",8);
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x80;
    } while (uVar7 < (ulong)((long)local_600.
                                   super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_600.
                                   super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 7));
  }
  if (local_600.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_600.
                    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_600.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_600.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5e8.
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5e8.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5e8.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5e8.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_6b8.
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6b8.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6b8.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6b8.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5c8.
      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5c8.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5c8.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5c8.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5a8.
      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5a8.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5a8.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5a8.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{

	bool verbose = true;
    high_resolution_clock::time_point t1, t2;

	// Intializes random number generator
	time_t t;
	srand((unsigned) time(&t));
	vector<float> timeVector;

    int powIter = 0;
    if (powIter > 1 && verbose)
	{
		std::cerr << "ERR: chack the number of iterations and the verbose option..." << std::endl;
		return 0;
	}
    std::vector<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>> ptPairs;
	std::vector<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>> plPairs;
	std::vector<std::pair<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>,std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>>> lPairs;
	std::vector<std::pair<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>,std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>>> lCPairs;
    for (int iter = 0 ; iter < pow(10,powIter) ; iter++){

		Matrix<double, 4,4> transGT;
		transGT = getGTTransformations<double>(verbose);

        lPairs.push_back(genLineIntPair<double>(transGT));
        lPairs.push_back(genLineIntPair<double>(transGT));
        lPairs.push_back(genLineIntPair<double>(transGT));
        lPairs.push_back(genLineIntPair<double>(transGT));
        lPairs.push_back(genLineIntPair<double>(transGT));
        lPairs.push_back(genLineIntPair<double>(transGT));

        if(verbose){
            
            cout << "GT transformation: " << endl;
            cout << transGT << endl;
        }
        
        // run solver
		t1 = high_resolution_clock::now();
		std::vector<Eigen::Matrix<double, 4,4>> estTrans = solver6L<double>(ptPairs,plPairs,lPairs,lCPairs);
		t2 = high_resolution_clock::now();
        auto duration = duration_cast<microseconds>( t2 - t1 ).count();

		Matrix<double, 4,4> estT;
        Matrix<double, 3,3> R;
        double transError = 1000;
        double rotError = 1000;
        AngleAxis<double> axAng;
        unsigned int numSols_count = 0;
        for(int iiter= 0; iiter < estTrans.size(); iiter++){
            estT = estTrans[iiter];
            if(!isnan(estT(1,1))){
                numSols_count++;
                if( (estT.topRightCorner(3,1) - transGT.topRightCorner(3,1)).norm() < transError)
                    transError = (estT.topRightCorner(3,1) - transGT.topRightCorner(3,1)).norm();
                R = estT.topLeftCorner(3,3)*transGT.topLeftCorner(3,3).transpose();
                axAng.fromRotationMatrix(R);
                if( abs(axAng.angle()) < rotError)
                    rotError = abs(axAng.angle());
                if (verbose) cout << "Estimated Transformation:" << endl << estT << endl;
                if (verbose) cout << "Error (frob norm): " << (transGT-estT).norm() << ", time: " << duration << endl;        
            }
        }      
	}

    return 0;

}